

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  ushort uVar13;
  undefined1 auVar14 [15];
  ushort uVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  unkuint9 Var28;
  undefined1 auVar29 [11];
  undefined1 auVar30 [15];
  unkuint9 Var31;
  undefined1 auVar32 [11];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  int iVar37;
  undefined1 (*pauVar38) [16];
  undefined1 auVar39 [16];
  ushort uVar46;
  ushort uVar48;
  undefined1 auVar47 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar64;
  short sVar67;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  short sVar105;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  undefined1 auVar106 [16];
  short sVar118;
  short sVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  short sVar124;
  short sVar125;
  short sVar131;
  short sVar133;
  short sVar135;
  short sVar137;
  short sVar139;
  short sVar141;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  short sVar143;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  byte bVar54;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar123;
  short sVar130;
  short sVar132;
  short sVar134;
  short sVar136;
  short sVar138;
  short sVar140;
  short sVar142;
  
  auVar1 = *(undefined1 (*) [16])above;
  auVar94 = *(undefined1 (*) [16])(above + 0x10);
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar1._0_13_;
  auVar11[0xe] = auVar1[7];
  uVar13 = auVar11._13_2_;
  auVar14[0xc] = auVar1[6];
  auVar14._0_12_ = auVar1._0_12_;
  auVar14._13_2_ = uVar13;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar1._0_11_;
  auVar17._12_3_ = auVar14._12_3_;
  auVar19[10] = auVar1[5];
  auVar19._0_10_ = auVar1._0_10_;
  auVar19._11_4_ = auVar17._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar1._0_9_;
  auVar21._10_5_ = auVar19._10_5_;
  auVar23[8] = auVar1[4];
  auVar23._0_8_ = auVar1._0_8_;
  auVar23._9_6_ = auVar21._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar23._8_7_;
  Var28 = CONCAT81(SUB158(auVar27 << 0x40,7),auVar1[3]);
  auVar33._9_6_ = 0;
  auVar33._0_9_ = Var28;
  auVar29._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar29[0] = auVar1[2];
  auVar34._11_4_ = 0;
  auVar34._0_11_ = auVar29;
  auVar25[2] = auVar1[1];
  auVar25._0_2_ = auVar1._0_2_;
  auVar25._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar144._0_2_ = auVar1._0_2_ & 0xff;
  auVar144._2_13_ = auVar25._2_13_;
  auVar144[0xf] = 0;
  auVar39._0_2_ = CONCAT11(0,auVar1[8]);
  bVar40 = auVar1[9];
  auVar39[2] = bVar40;
  auVar39[3] = 0;
  bVar41 = auVar1[10];
  auVar39[4] = bVar41;
  auVar39[5] = 0;
  bVar42 = auVar1[0xb];
  auVar39[6] = bVar42;
  auVar39[7] = 0;
  bVar43 = auVar1[0xc];
  auVar39[8] = bVar43;
  auVar39[9] = 0;
  bVar44 = auVar1[0xd];
  auVar39[10] = bVar44;
  auVar39[0xb] = 0;
  bVar45 = auVar1[0xe];
  auVar39[0xc] = bVar45;
  auVar39[0xd] = 0;
  auVar39[0xe] = auVar1[0xf];
  auVar39[0xf] = 0;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar94._0_13_;
  auVar12[0xe] = auVar94[7];
  uVar15 = auVar12._13_2_;
  auVar16[0xc] = auVar94[6];
  auVar16._0_12_ = auVar94._0_12_;
  auVar16._13_2_ = uVar15;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar94._0_11_;
  auVar18._12_3_ = auVar16._12_3_;
  auVar20[10] = auVar94[5];
  auVar20._0_10_ = auVar94._0_10_;
  auVar20._11_4_ = auVar18._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar94._0_9_;
  auVar22._10_5_ = auVar20._10_5_;
  auVar24[8] = auVar94[4];
  auVar24._0_8_ = auVar94._0_8_;
  auVar24._9_6_ = auVar22._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar24._8_7_;
  Var31 = CONCAT81(SUB158(auVar30 << 0x40,7),auVar94[3]);
  auVar35._9_6_ = 0;
  auVar35._0_9_ = Var31;
  auVar32._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar32[0] = auVar94[2];
  auVar36._11_4_ = 0;
  auVar36._0_11_ = auVar32;
  auVar26[2] = auVar94[1];
  auVar26._0_2_ = auVar94._0_2_;
  auVar26._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar55._0_2_ = auVar94._0_2_ & 0xff;
  auVar55._2_13_ = auVar26._2_13_;
  auVar55[0xf] = 0;
  auVar47._0_2_ = CONCAT11(0,auVar94[8]);
  auVar47[2] = auVar94[9];
  auVar47[3] = 0;
  bVar49 = auVar94[10];
  auVar47[4] = bVar49;
  auVar47[5] = 0;
  bVar50 = auVar94[0xb];
  auVar47[6] = bVar50;
  auVar47[7] = 0;
  bVar51 = auVar94[0xc];
  auVar47[8] = bVar51;
  auVar47[9] = 0;
  bVar52 = auVar94[0xd];
  auVar47[10] = bVar52;
  auVar47[0xb] = 0;
  bVar53 = auVar94[0xe];
  auVar47[0xc] = bVar53;
  auVar47[0xd] = 0;
  bVar54 = auVar94[0xf];
  auVar47[0xe] = bVar54;
  auVar47[0xf] = 0;
  auVar65 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  auVar66._0_4_ = auVar65._0_4_;
  auVar66._4_4_ = auVar66._0_4_;
  auVar66._8_4_ = auVar66._0_4_;
  auVar66._12_4_ = auVar66._0_4_;
  auVar69 = *(undefined1 (*) [16])left;
  sVar64 = auVar65._0_2_;
  auVar72._0_2_ = auVar144._0_2_ - sVar64;
  sVar67 = auVar65._2_2_;
  sVar83 = auVar25._2_2_;
  auVar72._2_2_ = sVar83 - sVar67;
  sVar84 = auVar29._0_2_;
  auVar72._4_2_ = sVar84 - sVar64;
  sVar85 = (short)Var28;
  auVar72._6_2_ = sVar85 - sVar67;
  sVar86 = auVar23._8_2_;
  auVar72._8_2_ = sVar86 - sVar64;
  sVar87 = auVar19._10_2_;
  auVar72._10_2_ = sVar87 - sVar67;
  sVar88 = auVar14._12_2_;
  auVar72._12_2_ = sVar88 - sVar64;
  auVar72._14_2_ = (uVar13 >> 8) - sVar67;
  auVar71 = pabsw(in_XMM6,auVar72);
  auVar56._0_2_ = auVar55._0_2_ - sVar64;
  sVar58 = auVar26._2_2_;
  auVar56._2_2_ = sVar58 - sVar67;
  sVar59 = auVar32._0_2_;
  auVar56._4_2_ = sVar59 - sVar64;
  sVar60 = (short)Var31;
  auVar56._6_2_ = sVar60 - sVar67;
  sVar61 = auVar24._8_2_;
  auVar56._8_2_ = sVar61 - sVar64;
  sVar62 = auVar20._10_2_;
  auVar56._10_2_ = sVar62 - sVar67;
  sVar63 = auVar16._12_2_;
  auVar56._12_2_ = sVar63 - sVar64;
  auVar56._14_2_ = (uVar15 >> 8) - sVar67;
  auVar57 = pabsw(auVar56,auVar56);
  pauVar38 = (undefined1 (*) [16])(dst + 0x10);
  iVar37 = 0x10;
  auVar65 = _DAT_004e3f60;
  do {
    auVar106 = pshufb(auVar69,auVar65);
    sVar105 = auVar106._0_2_;
    sVar107 = auVar106._2_2_;
    sVar108 = auVar106._4_2_;
    sVar110 = auVar106._6_2_;
    sVar112 = auVar106._8_2_;
    sVar114 = auVar106._10_2_;
    sVar116 = auVar106._12_2_;
    sVar118 = auVar106._14_2_;
    auVar89._0_2_ = (auVar72._0_2_ + sVar105) - auVar144._0_2_;
    auVar89._2_2_ = (auVar72._2_2_ + sVar107) - sVar83;
    auVar89._4_2_ = (auVar72._4_2_ + sVar108) - sVar84;
    auVar89._6_2_ = (auVar72._6_2_ + sVar110) - sVar85;
    auVar89._8_2_ = (auVar72._8_2_ + sVar112) - sVar86;
    auVar89._10_2_ = (auVar72._10_2_ + sVar114) - sVar87;
    auVar89._12_2_ = (auVar72._12_2_ + sVar116) - sVar88;
    auVar89._14_2_ = (auVar72._14_2_ + sVar118) - (uVar13 >> 8);
    auVar89 = pabsw(auVar89,auVar89);
    auVar96._0_2_ = (auVar72._0_2_ + sVar105) - sVar64;
    auVar96._2_2_ = (auVar72._2_2_ + sVar107) - sVar67;
    auVar96._4_2_ = (auVar72._4_2_ + sVar108) - sVar64;
    auVar96._6_2_ = (auVar72._6_2_ + sVar110) - sVar67;
    auVar96._8_2_ = (auVar72._8_2_ + sVar112) - sVar64;
    auVar96._10_2_ = (auVar72._10_2_ + sVar114) - sVar67;
    auVar96._12_2_ = (auVar72._12_2_ + sVar116) - sVar64;
    auVar96._14_2_ = (auVar72._14_2_ + sVar118) - sVar67;
    auVar97 = pabsw(auVar96,auVar96);
    sVar123 = auVar71._0_2_;
    auVar126._0_2_ = -(ushort)(auVar89._0_2_ < sVar123);
    sVar130 = auVar71._2_2_;
    auVar126._2_2_ = -(ushort)(auVar89._2_2_ < sVar130);
    sVar132 = auVar71._4_2_;
    auVar126._4_2_ = -(ushort)(auVar89._4_2_ < sVar132);
    sVar134 = auVar71._6_2_;
    auVar126._6_2_ = -(ushort)(auVar89._6_2_ < sVar134);
    sVar136 = auVar71._8_2_;
    auVar126._8_2_ = -(ushort)(auVar89._8_2_ < sVar136);
    sVar138 = auVar71._10_2_;
    auVar126._10_2_ = -(ushort)(auVar89._10_2_ < sVar138);
    sVar140 = auVar71._12_2_;
    sVar142 = auVar71._14_2_;
    auVar126._12_2_ = -(ushort)(auVar89._12_2_ < sVar140);
    auVar126._14_2_ = -(ushort)(auVar89._14_2_ < sVar142);
    auVar120._0_2_ = -(ushort)(auVar97._0_2_ < sVar123);
    auVar120._2_2_ = -(ushort)(auVar97._2_2_ < sVar130);
    auVar120._4_2_ = -(ushort)(auVar97._4_2_ < sVar132);
    auVar120._6_2_ = -(ushort)(auVar97._6_2_ < sVar134);
    auVar120._8_2_ = -(ushort)(auVar97._8_2_ < sVar136);
    auVar120._10_2_ = -(ushort)(auVar97._10_2_ < sVar138);
    auVar120._12_2_ = -(ushort)(auVar97._12_2_ < sVar140);
    auVar120._14_2_ = -(ushort)(auVar97._14_2_ < sVar142);
    auVar121._0_2_ = -(ushort)(auVar97._0_2_ < auVar89._0_2_);
    auVar121._2_2_ = -(ushort)(auVar97._2_2_ < auVar89._2_2_);
    auVar121._4_2_ = -(ushort)(auVar97._4_2_ < auVar89._4_2_);
    auVar121._6_2_ = -(ushort)(auVar97._6_2_ < auVar89._6_2_);
    auVar121._8_2_ = -(ushort)(auVar97._8_2_ < auVar89._8_2_);
    auVar121._10_2_ = -(ushort)(auVar97._10_2_ < auVar89._10_2_);
    auVar121._12_2_ = -(ushort)(auVar97._12_2_ < auVar89._12_2_);
    auVar121._14_2_ = -(ushort)(auVar97._14_2_ < auVar89._14_2_);
    auVar145._0_2_ = sVar105 - sVar64;
    auVar145._2_2_ = sVar107 - sVar67;
    auVar145._4_2_ = sVar108 - sVar64;
    auVar145._6_2_ = sVar110 - sVar67;
    auVar145._8_2_ = sVar112 - sVar64;
    auVar145._10_2_ = sVar114 - sVar67;
    auVar145._12_2_ = sVar116 - sVar64;
    auVar145._14_2_ = sVar118 - sVar67;
    uVar46 = (ushort)auVar1[0xf];
    auVar127._0_2_ = auVar39._0_2_ - sVar64;
    auVar127._2_2_ = (ushort)bVar40 - sVar67;
    auVar127._4_2_ = (ushort)bVar41 - sVar64;
    auVar127._6_2_ = (ushort)bVar42 - sVar67;
    auVar127._8_2_ = (ushort)bVar43 - sVar64;
    auVar127._10_2_ = (ushort)bVar44 - sVar67;
    auVar127._12_2_ = (ushort)bVar45 - sVar64;
    auVar127._14_2_ = uVar46 - sVar67;
    auVar89 = pabsw(in_XMM5,auVar127);
    auVar97 = pabsw(auVar127,auVar145);
    auVar98._0_2_ = (auVar145._0_2_ + auVar39._0_2_) - sVar64;
    auVar98._2_2_ = (auVar145._2_2_ + (ushort)bVar40) - sVar67;
    auVar98._4_2_ = (auVar145._4_2_ + (ushort)bVar41) - sVar64;
    auVar98._6_2_ = (auVar145._6_2_ + (ushort)bVar42) - sVar67;
    auVar98._8_2_ = (auVar145._8_2_ + (ushort)bVar43) - sVar64;
    auVar98._10_2_ = (auVar145._10_2_ + (ushort)bVar44) - sVar67;
    auVar98._12_2_ = (auVar145._12_2_ + (ushort)bVar45) - sVar64;
    auVar98._14_2_ = (auVar145._14_2_ + uVar46) - sVar67;
    auVar99 = pabsw(auVar98,auVar98);
    sVar124 = auVar97._0_2_;
    auVar73._0_2_ = -(ushort)(sVar124 < auVar89._0_2_);
    sVar111 = auVar97._2_2_;
    auVar73._2_2_ = -(ushort)(sVar111 < auVar89._2_2_);
    sVar115 = auVar97._4_2_;
    auVar73._4_2_ = -(ushort)(sVar115 < auVar89._4_2_);
    sVar119 = auVar97._6_2_;
    auVar73._6_2_ = -(ushort)(sVar119 < auVar89._6_2_);
    sVar131 = auVar97._8_2_;
    auVar73._8_2_ = -(ushort)(sVar131 < auVar89._8_2_);
    sVar135 = auVar97._10_2_;
    auVar73._10_2_ = -(ushort)(sVar135 < auVar89._10_2_);
    sVar139 = auVar97._12_2_;
    auVar73._12_2_ = -(ushort)(sVar139 < auVar89._12_2_);
    sVar143 = auVar97._14_2_;
    auVar73._14_2_ = -(ushort)(sVar143 < auVar89._14_2_);
    auVar97._0_2_ = -(ushort)(auVar99._0_2_ < auVar89._0_2_);
    auVar97._2_2_ = -(ushort)(auVar99._2_2_ < auVar89._2_2_);
    auVar97._4_2_ = -(ushort)(auVar99._4_2_ < auVar89._4_2_);
    auVar97._6_2_ = -(ushort)(auVar99._6_2_ < auVar89._6_2_);
    auVar97._8_2_ = -(ushort)(auVar99._8_2_ < auVar89._8_2_);
    auVar97._10_2_ = -(ushort)(auVar99._10_2_ < auVar89._10_2_);
    auVar97._12_2_ = -(ushort)(auVar99._12_2_ < auVar89._12_2_);
    auVar97._14_2_ = -(ushort)(auVar99._14_2_ < auVar89._14_2_);
    auVar74._0_2_ = -(ushort)(auVar99._0_2_ < sVar124);
    auVar74._2_2_ = -(ushort)(auVar99._2_2_ < sVar111);
    auVar74._4_2_ = -(ushort)(auVar99._4_2_ < sVar115);
    auVar74._6_2_ = -(ushort)(auVar99._6_2_ < sVar119);
    auVar74._8_2_ = -(ushort)(auVar99._8_2_ < sVar131);
    auVar74._10_2_ = -(ushort)(auVar99._10_2_ < sVar135);
    auVar74._12_2_ = -(ushort)(auVar99._12_2_ < sVar139);
    auVar74._14_2_ = -(ushort)(auVar99._14_2_ < sVar143);
    auVar121 = ~(auVar120 | auVar126) & auVar106 |
               (~auVar121 & auVar144 | auVar66 & auVar121) & (auVar120 | auVar126);
    auVar89 = ~(auVar97 | auVar73) & auVar106 |
              (~auVar74 & auVar39 | auVar66 & auVar74) & (auVar97 | auVar73);
    sVar2 = auVar121._0_2_;
    sVar3 = auVar121._2_2_;
    sVar4 = auVar121._4_2_;
    sVar5 = auVar121._6_2_;
    sVar6 = auVar121._8_2_;
    sVar7 = auVar121._10_2_;
    sVar8 = auVar121._12_2_;
    sVar9 = auVar121._14_2_;
    sVar10 = auVar89._0_2_;
    sVar109 = auVar89._2_2_;
    sVar113 = auVar89._4_2_;
    sVar117 = auVar89._6_2_;
    sVar125 = auVar89._8_2_;
    sVar133 = auVar89._10_2_;
    sVar137 = auVar89._12_2_;
    sVar141 = auVar89._14_2_;
    auVar75._0_2_ = (auVar56._0_2_ + sVar105) - auVar55._0_2_;
    auVar75._2_2_ = (auVar56._2_2_ + sVar107) - sVar58;
    auVar75._4_2_ = (auVar56._4_2_ + sVar108) - sVar59;
    auVar75._6_2_ = (auVar56._6_2_ + sVar110) - sVar60;
    auVar75._8_2_ = (auVar56._8_2_ + sVar112) - sVar61;
    auVar75._10_2_ = (auVar56._10_2_ + sVar114) - sVar62;
    auVar75._12_2_ = (auVar56._12_2_ + sVar116) - sVar63;
    auVar75._14_2_ = (auVar56._14_2_ + sVar118) - (uVar15 >> 8);
    auVar100 = pabsw(auVar66 & auVar74,auVar75);
    auVar99._0_2_ = (auVar56._0_2_ + sVar105) - sVar64;
    auVar99._2_2_ = (auVar56._2_2_ + sVar107) - sVar67;
    auVar99._4_2_ = (auVar56._4_2_ + sVar108) - sVar64;
    auVar99._6_2_ = (auVar56._6_2_ + sVar110) - sVar67;
    auVar99._8_2_ = (auVar56._8_2_ + sVar112) - sVar64;
    auVar99._10_2_ = (auVar56._10_2_ + sVar114) - sVar67;
    auVar99._12_2_ = (auVar56._12_2_ + sVar116) - sVar64;
    auVar99._14_2_ = (auVar56._14_2_ + sVar118) - sVar67;
    auVar97 = pabsw(auVar99,auVar99);
    local_38 = auVar57._0_2_;
    sStack_36 = auVar57._2_2_;
    sStack_34 = auVar57._4_2_;
    sStack_32 = auVar57._6_2_;
    sStack_30 = auVar57._8_2_;
    sStack_2e = auVar57._10_2_;
    sStack_2c = auVar57._12_2_;
    sStack_2a = auVar57._14_2_;
    auVar76._0_2_ = -(ushort)(auVar100._0_2_ < local_38);
    auVar76._2_2_ = -(ushort)(auVar100._2_2_ < sStack_36);
    auVar76._4_2_ = -(ushort)(auVar100._4_2_ < sStack_34);
    auVar76._6_2_ = -(ushort)(auVar100._6_2_ < sStack_32);
    auVar76._8_2_ = -(ushort)(auVar100._8_2_ < sStack_30);
    auVar76._10_2_ = -(ushort)(auVar100._10_2_ < sStack_2e);
    auVar76._12_2_ = -(ushort)(auVar100._12_2_ < sStack_2c);
    auVar76._14_2_ = -(ushort)(auVar100._14_2_ < sStack_2a);
    auVar90._0_2_ = -(ushort)(auVar97._0_2_ < local_38);
    auVar90._2_2_ = -(ushort)(auVar97._2_2_ < sStack_36);
    auVar90._4_2_ = -(ushort)(auVar97._4_2_ < sStack_34);
    auVar90._6_2_ = -(ushort)(auVar97._6_2_ < sStack_32);
    auVar90._8_2_ = -(ushort)(auVar97._8_2_ < sStack_30);
    auVar90._10_2_ = -(ushort)(auVar97._10_2_ < sStack_2e);
    auVar90._12_2_ = -(ushort)(auVar97._12_2_ < sStack_2c);
    auVar90._14_2_ = -(ushort)(auVar97._14_2_ < sStack_2a);
    auVar101._0_2_ = -(ushort)(auVar97._0_2_ < auVar100._0_2_);
    auVar101._2_2_ = -(ushort)(auVar97._2_2_ < auVar100._2_2_);
    auVar101._4_2_ = -(ushort)(auVar97._4_2_ < auVar100._4_2_);
    auVar101._6_2_ = -(ushort)(auVar97._6_2_ < auVar100._6_2_);
    auVar101._8_2_ = -(ushort)(auVar97._8_2_ < auVar100._8_2_);
    auVar101._10_2_ = -(ushort)(auVar97._10_2_ < auVar100._10_2_);
    auVar101._12_2_ = -(ushort)(auVar97._12_2_ < auVar100._12_2_);
    auVar101._14_2_ = -(ushort)(auVar97._14_2_ < auVar100._14_2_);
    uVar48 = (ushort)auVar94[9];
    auVar100._0_2_ = auVar47._0_2_ - sVar64;
    auVar100._2_2_ = uVar48 - sVar67;
    auVar100._4_2_ = (ushort)bVar49 - sVar64;
    auVar100._6_2_ = (ushort)bVar50 - sVar67;
    auVar100._8_2_ = (ushort)bVar51 - sVar64;
    auVar100._10_2_ = (ushort)bVar52 - sVar67;
    auVar100._12_2_ = (ushort)bVar53 - sVar64;
    auVar100._14_2_ = (ushort)bVar54 - sVar67;
    auVar97 = pabsw(auVar100,auVar100);
    auVar146._0_2_ = (auVar145._0_2_ + auVar47._0_2_) - sVar64;
    auVar146._2_2_ = (auVar145._2_2_ + uVar48) - sVar67;
    auVar146._4_2_ = (auVar145._4_2_ + (ushort)bVar49) - sVar64;
    auVar146._6_2_ = (auVar145._6_2_ + (ushort)bVar50) - sVar67;
    auVar146._8_2_ = (auVar145._8_2_ + (ushort)bVar51) - sVar64;
    auVar146._10_2_ = (auVar145._10_2_ + (ushort)bVar52) - sVar67;
    auVar146._12_2_ = (auVar145._12_2_ + (ushort)bVar53) - sVar64;
    auVar146._14_2_ = (auVar145._14_2_ + (ushort)bVar54) - sVar67;
    auVar99 = pabsw(auVar76,auVar146);
    auVar147._0_2_ = -(ushort)(sVar124 < auVar97._0_2_);
    auVar147._2_2_ = -(ushort)(sVar111 < auVar97._2_2_);
    auVar147._4_2_ = -(ushort)(sVar115 < auVar97._4_2_);
    auVar147._6_2_ = -(ushort)(sVar119 < auVar97._6_2_);
    auVar147._8_2_ = -(ushort)(sVar131 < auVar97._8_2_);
    auVar147._10_2_ = -(ushort)(sVar135 < auVar97._10_2_);
    auVar147._12_2_ = -(ushort)(sVar139 < auVar97._12_2_);
    auVar147._14_2_ = -(ushort)(sVar143 < auVar97._14_2_);
    auVar68._0_2_ = -(ushort)(auVar99._0_2_ < auVar97._0_2_);
    auVar68._2_2_ = -(ushort)(auVar99._2_2_ < auVar97._2_2_);
    auVar68._4_2_ = -(ushort)(auVar99._4_2_ < auVar97._4_2_);
    auVar68._6_2_ = -(ushort)(auVar99._6_2_ < auVar97._6_2_);
    auVar68._8_2_ = -(ushort)(auVar99._8_2_ < auVar97._8_2_);
    auVar68._10_2_ = -(ushort)(auVar99._10_2_ < auVar97._10_2_);
    auVar68._12_2_ = -(ushort)(auVar99._12_2_ < auVar97._12_2_);
    auVar68._14_2_ = -(ushort)(auVar99._14_2_ < auVar97._14_2_);
    auVar128._0_2_ = -(ushort)(auVar99._0_2_ < sVar124);
    auVar128._2_2_ = -(ushort)(auVar99._2_2_ < sVar111);
    auVar128._4_2_ = -(ushort)(auVar99._4_2_ < sVar115);
    auVar128._6_2_ = -(ushort)(auVar99._6_2_ < sVar119);
    auVar128._8_2_ = -(ushort)(auVar99._8_2_ < sVar131);
    auVar128._10_2_ = -(ushort)(auVar99._10_2_ < sVar135);
    auVar128._12_2_ = -(ushort)(auVar99._12_2_ < sVar139);
    auVar128._14_2_ = -(ushort)(auVar99._14_2_ < sVar143);
    auVar102 = (~auVar101 & auVar55 | auVar66 & auVar101) & (auVar90 | auVar76);
    auVar97 = ~(auVar90 | auVar76) & auVar106 | auVar102;
    auVar99 = (~auVar128 & auVar47 | auVar66 & auVar128) & (auVar68 | auVar147);
    in_XMM5 = ~(auVar68 | auVar147) & auVar106 | auVar99;
    sVar105 = auVar97._0_2_;
    sVar107 = auVar97._2_2_;
    sVar108 = auVar97._4_2_;
    sVar110 = auVar97._6_2_;
    sVar112 = auVar97._8_2_;
    sVar114 = auVar97._10_2_;
    sVar116 = auVar97._12_2_;
    sVar118 = auVar97._14_2_;
    sVar124 = in_XMM5._0_2_;
    sVar111 = in_XMM5._2_2_;
    sVar115 = in_XMM5._4_2_;
    sVar119 = in_XMM5._6_2_;
    sVar131 = in_XMM5._8_2_;
    sVar135 = in_XMM5._10_2_;
    sVar139 = in_XMM5._12_2_;
    sVar143 = in_XMM5._14_2_;
    pauVar38[-1][0] = (0 < sVar2) * (sVar2 < 0x100) * auVar121[0] - (0xff < sVar2);
    pauVar38[-1][1] = (0 < sVar3) * (sVar3 < 0x100) * auVar121[2] - (0xff < sVar3);
    pauVar38[-1][2] = (0 < sVar4) * (sVar4 < 0x100) * auVar121[4] - (0xff < sVar4);
    pauVar38[-1][3] = (0 < sVar5) * (sVar5 < 0x100) * auVar121[6] - (0xff < sVar5);
    pauVar38[-1][4] = (0 < sVar6) * (sVar6 < 0x100) * auVar121[8] - (0xff < sVar6);
    pauVar38[-1][5] = (0 < sVar7) * (sVar7 < 0x100) * auVar121[10] - (0xff < sVar7);
    pauVar38[-1][6] = (0 < sVar8) * (sVar8 < 0x100) * auVar121[0xc] - (0xff < sVar8);
    pauVar38[-1][7] = (0 < sVar9) * (sVar9 < 0x100) * auVar121[0xe] - (0xff < sVar9);
    pauVar38[-1][8] = (0 < sVar10) * (sVar10 < 0x100) * auVar89[0] - (0xff < sVar10);
    pauVar38[-1][9] = (0 < sVar109) * (sVar109 < 0x100) * auVar89[2] - (0xff < sVar109);
    pauVar38[-1][10] = (0 < sVar113) * (sVar113 < 0x100) * auVar89[4] - (0xff < sVar113);
    pauVar38[-1][0xb] = (0 < sVar117) * (sVar117 < 0x100) * auVar89[6] - (0xff < sVar117);
    pauVar38[-1][0xc] = (0 < sVar125) * (sVar125 < 0x100) * auVar89[8] - (0xff < sVar125);
    pauVar38[-1][0xd] = (0 < sVar133) * (sVar133 < 0x100) * auVar89[10] - (0xff < sVar133);
    pauVar38[-1][0xe] = (0 < sVar137) * (sVar137 < 0x100) * auVar89[0xc] - (0xff < sVar137);
    pauVar38[-1][0xf] = (0 < sVar141) * (sVar141 < 0x100) * auVar89[0xe] - (0xff < sVar141);
    (*pauVar38)[0] = (0 < sVar105) * (sVar105 < 0x100) * auVar97[0] - (0xff < sVar105);
    (*pauVar38)[1] = (0 < sVar107) * (sVar107 < 0x100) * auVar97[2] - (0xff < sVar107);
    (*pauVar38)[2] = (0 < sVar108) * (sVar108 < 0x100) * auVar97[4] - (0xff < sVar108);
    (*pauVar38)[3] = (0 < sVar110) * (sVar110 < 0x100) * auVar97[6] - (0xff < sVar110);
    (*pauVar38)[4] = (0 < sVar112) * (sVar112 < 0x100) * auVar97[8] - (0xff < sVar112);
    (*pauVar38)[5] = (0 < sVar114) * (sVar114 < 0x100) * auVar97[10] - (0xff < sVar114);
    (*pauVar38)[6] = (0 < sVar116) * (sVar116 < 0x100) * auVar97[0xc] - (0xff < sVar116);
    (*pauVar38)[7] = (0 < sVar118) * (sVar118 < 0x100) * auVar97[0xe] - (0xff < sVar118);
    (*pauVar38)[8] = (0 < sVar124) * (sVar124 < 0x100) * in_XMM5[0] - (0xff < sVar124);
    (*pauVar38)[9] = (0 < sVar111) * (sVar111 < 0x100) * in_XMM5[2] - (0xff < sVar111);
    (*pauVar38)[10] = (0 < sVar115) * (sVar115 < 0x100) * in_XMM5[4] - (0xff < sVar115);
    (*pauVar38)[0xb] = (0 < sVar119) * (sVar119 < 0x100) * in_XMM5[6] - (0xff < sVar119);
    (*pauVar38)[0xc] = (0 < sVar131) * (sVar131 < 0x100) * in_XMM5[8] - (0xff < sVar131);
    (*pauVar38)[0xd] = (0 < sVar135) * (sVar135 < 0x100) * in_XMM5[10] - (0xff < sVar135);
    (*pauVar38)[0xe] = (0 < sVar139) * (sVar139 < 0x100) * in_XMM5[0xc] - (0xff < sVar139);
    (*pauVar38)[0xf] = (0 < sVar143) * (sVar143 < 0x100) * in_XMM5[0xe] - (0xff < sVar143);
    auVar106._0_2_ = auVar65._0_2_ + 1;
    auVar106._2_2_ = auVar65._2_2_ + 1;
    auVar106._4_2_ = auVar65._4_2_ + 1;
    auVar106._6_2_ = auVar65._6_2_ + 1;
    auVar106._8_2_ = auVar65._8_2_ + 1;
    auVar106._10_2_ = auVar65._10_2_ + 1;
    auVar106._12_2_ = auVar65._12_2_ + 1;
    auVar106._14_2_ = auVar65._14_2_ + 1;
    pauVar38 = (undefined1 (*) [16])(*pauVar38 + stride);
    iVar37 = iVar37 + -1;
    auVar65 = auVar106;
  } while (iVar37 != 0);
  auVar1 = *(undefined1 (*) [16])(left + 0x10);
  iVar37 = 0x10;
  auVar94 = _DAT_004e3f60;
  do {
    auVar89 = pshufb(auVar1,auVar94);
    sVar105 = auVar89._0_2_;
    sVar107 = auVar89._2_2_;
    sVar109 = auVar89._4_2_;
    sVar111 = auVar89._6_2_;
    sVar113 = auVar89._8_2_;
    sVar115 = auVar89._10_2_;
    sVar117 = auVar89._12_2_;
    sVar119 = auVar89._14_2_;
    auVar77._0_2_ = (auVar72._0_2_ + sVar105) - auVar144._0_2_;
    auVar77._2_2_ = (auVar72._2_2_ + sVar107) - sVar83;
    auVar77._4_2_ = (auVar72._4_2_ + sVar109) - sVar84;
    auVar77._6_2_ = (auVar72._6_2_ + sVar111) - sVar85;
    auVar77._8_2_ = (auVar72._8_2_ + sVar113) - sVar86;
    auVar77._10_2_ = (auVar72._10_2_ + sVar115) - sVar87;
    auVar77._12_2_ = (auVar72._12_2_ + sVar117) - sVar88;
    auVar77._14_2_ = (auVar72._14_2_ + sVar119) - (uVar13 >> 8);
    auVar65 = pabsw(auVar102,auVar77);
    auVar69._0_2_ = (auVar72._0_2_ + sVar105) - sVar64;
    auVar69._2_2_ = (auVar72._2_2_ + sVar107) - sVar67;
    auVar69._4_2_ = (auVar72._4_2_ + sVar109) - sVar64;
    auVar69._6_2_ = (auVar72._6_2_ + sVar111) - sVar67;
    auVar69._8_2_ = (auVar72._8_2_ + sVar113) - sVar64;
    auVar69._10_2_ = (auVar72._10_2_ + sVar115) - sVar67;
    auVar69._12_2_ = (auVar72._12_2_ + sVar117) - sVar64;
    auVar69._14_2_ = (auVar72._14_2_ + sVar119) - sVar67;
    auVar69 = pabsw(auVar69,auVar69);
    auVar78._0_2_ = -(ushort)(auVar65._0_2_ < sVar123);
    auVar78._2_2_ = -(ushort)(auVar65._2_2_ < sVar130);
    auVar78._4_2_ = -(ushort)(auVar65._4_2_ < sVar132);
    auVar78._6_2_ = -(ushort)(auVar65._6_2_ < sVar134);
    auVar78._8_2_ = -(ushort)(auVar65._8_2_ < sVar136);
    auVar78._10_2_ = -(ushort)(auVar65._10_2_ < sVar138);
    auVar78._12_2_ = -(ushort)(auVar65._12_2_ < sVar140);
    auVar78._14_2_ = -(ushort)(auVar65._14_2_ < sVar142);
    auVar122._0_2_ = -(ushort)(auVar69._0_2_ < sVar123);
    auVar122._2_2_ = -(ushort)(auVar69._2_2_ < sVar130);
    auVar122._4_2_ = -(ushort)(auVar69._4_2_ < sVar132);
    auVar122._6_2_ = -(ushort)(auVar69._6_2_ < sVar134);
    auVar122._8_2_ = -(ushort)(auVar69._8_2_ < sVar136);
    auVar122._10_2_ = -(ushort)(auVar69._10_2_ < sVar138);
    auVar122._12_2_ = -(ushort)(auVar69._12_2_ < sVar140);
    auVar122._14_2_ = -(ushort)(auVar69._14_2_ < sVar142);
    auVar103._0_2_ = -(ushort)(auVar69._0_2_ < auVar65._0_2_);
    auVar103._2_2_ = -(ushort)(auVar69._2_2_ < auVar65._2_2_);
    auVar103._4_2_ = -(ushort)(auVar69._4_2_ < auVar65._4_2_);
    auVar103._6_2_ = -(ushort)(auVar69._6_2_ < auVar65._6_2_);
    auVar103._8_2_ = -(ushort)(auVar69._8_2_ < auVar65._8_2_);
    auVar103._10_2_ = -(ushort)(auVar69._10_2_ < auVar65._10_2_);
    auVar103._12_2_ = -(ushort)(auVar69._12_2_ < auVar65._12_2_);
    auVar103._14_2_ = -(ushort)(auVar69._14_2_ < auVar65._14_2_);
    auVar148._0_2_ = sVar105 - sVar64;
    auVar148._2_2_ = sVar107 - sVar67;
    auVar148._4_2_ = sVar109 - sVar64;
    auVar148._6_2_ = sVar111 - sVar67;
    auVar148._8_2_ = sVar113 - sVar64;
    auVar148._10_2_ = sVar115 - sVar67;
    auVar148._12_2_ = sVar117 - sVar64;
    auVar148._14_2_ = sVar119 - sVar67;
    auVar79._0_2_ = auVar39._0_2_ - sVar64;
    auVar79._2_2_ = (ushort)bVar40 - sVar67;
    auVar79._4_2_ = (ushort)bVar41 - sVar64;
    auVar79._6_2_ = (ushort)bVar42 - sVar67;
    auVar79._8_2_ = (ushort)bVar43 - sVar64;
    auVar79._10_2_ = (ushort)bVar44 - sVar67;
    auVar79._12_2_ = (ushort)bVar45 - sVar64;
    auVar79._14_2_ = uVar46 - sVar67;
    auVar57 = pabsw(auVar79,auVar79);
    auVar71 = pabsw(auVar99,auVar148);
    auVar65._0_2_ = (auVar148._0_2_ + auVar39._0_2_) - sVar64;
    auVar65._2_2_ = (auVar148._2_2_ + (ushort)bVar40) - sVar67;
    auVar65._4_2_ = (auVar148._4_2_ + (ushort)bVar41) - sVar64;
    auVar65._6_2_ = (auVar148._6_2_ + (ushort)bVar42) - sVar67;
    auVar65._8_2_ = (auVar148._8_2_ + (ushort)bVar43) - sVar64;
    auVar65._10_2_ = (auVar148._10_2_ + (ushort)bVar44) - sVar67;
    auVar65._12_2_ = (auVar148._12_2_ + (ushort)bVar45) - sVar64;
    auVar65._14_2_ = (auVar148._14_2_ + uVar46) - sVar67;
    auVar69 = pabsw(auVar65,auVar65);
    sVar125 = auVar71._0_2_;
    auVar91._0_2_ = -(ushort)(sVar125 < auVar57._0_2_);
    sVar131 = auVar71._2_2_;
    auVar91._2_2_ = -(ushort)(sVar131 < auVar57._2_2_);
    sVar133 = auVar71._4_2_;
    auVar91._4_2_ = -(ushort)(sVar133 < auVar57._4_2_);
    sVar135 = auVar71._6_2_;
    auVar91._6_2_ = -(ushort)(sVar135 < auVar57._6_2_);
    sVar137 = auVar71._8_2_;
    auVar91._8_2_ = -(ushort)(sVar137 < auVar57._8_2_);
    sVar139 = auVar71._10_2_;
    auVar91._10_2_ = -(ushort)(sVar139 < auVar57._10_2_);
    sVar141 = auVar71._12_2_;
    auVar91._12_2_ = -(ushort)(sVar141 < auVar57._12_2_);
    sVar143 = auVar71._14_2_;
    auVar91._14_2_ = -(ushort)(sVar143 < auVar57._14_2_);
    auVar80._0_2_ = -(ushort)(auVar69._0_2_ < auVar57._0_2_);
    auVar80._2_2_ = -(ushort)(auVar69._2_2_ < auVar57._2_2_);
    auVar80._4_2_ = -(ushort)(auVar69._4_2_ < auVar57._4_2_);
    auVar80._6_2_ = -(ushort)(auVar69._6_2_ < auVar57._6_2_);
    auVar80._8_2_ = -(ushort)(auVar69._8_2_ < auVar57._8_2_);
    auVar80._10_2_ = -(ushort)(auVar69._10_2_ < auVar57._10_2_);
    auVar80._12_2_ = -(ushort)(auVar69._12_2_ < auVar57._12_2_);
    auVar80._14_2_ = -(ushort)(auVar69._14_2_ < auVar57._14_2_);
    auVar92._0_2_ = -(ushort)(auVar69._0_2_ < sVar125);
    auVar92._2_2_ = -(ushort)(auVar69._2_2_ < sVar131);
    auVar92._4_2_ = -(ushort)(auVar69._4_2_ < sVar133);
    auVar92._6_2_ = -(ushort)(auVar69._6_2_ < sVar135);
    auVar92._8_2_ = -(ushort)(auVar69._8_2_ < sVar137);
    auVar92._10_2_ = -(ushort)(auVar69._10_2_ < sVar139);
    auVar92._12_2_ = -(ushort)(auVar69._12_2_ < sVar141);
    auVar92._14_2_ = -(ushort)(auVar69._14_2_ < sVar143);
    auVar97 = ~(auVar122 | auVar78) & auVar89 |
              (~auVar103 & auVar144 | auVar66 & auVar103) & (auVar122 | auVar78);
    auVar69 = (~auVar92 & auVar39 | auVar66 & auVar92) & (auVar80 | auVar91);
    auVar65 = ~(auVar80 | auVar91) & auVar89 | auVar69;
    sVar2 = auVar97._0_2_;
    sVar3 = auVar97._2_2_;
    sVar4 = auVar97._4_2_;
    sVar108 = auVar97._6_2_;
    sVar5 = auVar97._8_2_;
    sVar110 = auVar97._10_2_;
    sVar6 = auVar97._12_2_;
    sVar112 = auVar97._14_2_;
    sVar7 = auVar65._0_2_;
    sVar114 = auVar65._2_2_;
    sVar8 = auVar65._4_2_;
    sVar116 = auVar65._6_2_;
    sVar9 = auVar65._8_2_;
    sVar118 = auVar65._10_2_;
    sVar10 = auVar65._12_2_;
    sVar124 = auVar65._14_2_;
    auVar81._0_2_ = (auVar56._0_2_ + sVar105) - auVar55._0_2_;
    auVar81._2_2_ = (auVar56._2_2_ + sVar107) - sVar58;
    auVar81._4_2_ = (auVar56._4_2_ + sVar109) - sVar59;
    auVar81._6_2_ = (auVar56._6_2_ + sVar111) - sVar60;
    auVar81._8_2_ = (auVar56._8_2_ + sVar113) - sVar61;
    auVar81._10_2_ = (auVar56._10_2_ + sVar115) - sVar62;
    auVar81._12_2_ = (auVar56._12_2_ + sVar117) - sVar63;
    auVar81._14_2_ = (auVar56._14_2_ + sVar119) - (uVar15 >> 8);
    auVar71 = pabsw(auVar69,auVar81);
    auVar57._0_2_ = (auVar56._0_2_ + sVar105) - sVar64;
    auVar57._2_2_ = (auVar56._2_2_ + sVar107) - sVar67;
    auVar57._4_2_ = (auVar56._4_2_ + sVar109) - sVar64;
    auVar57._6_2_ = (auVar56._6_2_ + sVar111) - sVar67;
    auVar57._8_2_ = (auVar56._8_2_ + sVar113) - sVar64;
    auVar57._10_2_ = (auVar56._10_2_ + sVar115) - sVar67;
    auVar57._12_2_ = (auVar56._12_2_ + sVar117) - sVar64;
    auVar57._14_2_ = (auVar56._14_2_ + sVar119) - sVar67;
    auVar69 = pabsw(auVar57,auVar57);
    auVar82._0_2_ = -(ushort)(auVar71._0_2_ < local_38);
    auVar82._2_2_ = -(ushort)(auVar71._2_2_ < sStack_36);
    auVar82._4_2_ = -(ushort)(auVar71._4_2_ < sStack_34);
    auVar82._6_2_ = -(ushort)(auVar71._6_2_ < sStack_32);
    auVar82._8_2_ = -(ushort)(auVar71._8_2_ < sStack_30);
    auVar82._10_2_ = -(ushort)(auVar71._10_2_ < sStack_2e);
    auVar82._12_2_ = -(ushort)(auVar71._12_2_ < sStack_2c);
    auVar82._14_2_ = -(ushort)(auVar71._14_2_ < sStack_2a);
    auVar104._0_2_ = -(ushort)(auVar69._0_2_ < local_38);
    auVar104._2_2_ = -(ushort)(auVar69._2_2_ < sStack_36);
    auVar104._4_2_ = -(ushort)(auVar69._4_2_ < sStack_34);
    auVar104._6_2_ = -(ushort)(auVar69._6_2_ < sStack_32);
    auVar104._8_2_ = -(ushort)(auVar69._8_2_ < sStack_30);
    auVar104._10_2_ = -(ushort)(auVar69._10_2_ < sStack_2e);
    auVar104._12_2_ = -(ushort)(auVar69._12_2_ < sStack_2c);
    auVar104._14_2_ = -(ushort)(auVar69._14_2_ < sStack_2a);
    auVar93._0_2_ = -(ushort)(auVar69._0_2_ < auVar71._0_2_);
    auVar93._2_2_ = -(ushort)(auVar69._2_2_ < auVar71._2_2_);
    auVar93._4_2_ = -(ushort)(auVar69._4_2_ < auVar71._4_2_);
    auVar93._6_2_ = -(ushort)(auVar69._6_2_ < auVar71._6_2_);
    auVar93._8_2_ = -(ushort)(auVar69._8_2_ < auVar71._8_2_);
    auVar93._10_2_ = -(ushort)(auVar69._10_2_ < auVar71._10_2_);
    auVar93._12_2_ = -(ushort)(auVar69._12_2_ < auVar71._12_2_);
    auVar93._14_2_ = -(ushort)(auVar69._14_2_ < auVar71._14_2_);
    auVar71._0_2_ = auVar47._0_2_ - sVar64;
    auVar71._2_2_ = uVar48 - sVar67;
    auVar71._4_2_ = (ushort)bVar49 - sVar64;
    auVar71._6_2_ = (ushort)bVar50 - sVar67;
    auVar71._8_2_ = (ushort)bVar51 - sVar64;
    auVar71._10_2_ = (ushort)bVar52 - sVar67;
    auVar71._12_2_ = (ushort)bVar53 - sVar64;
    auVar71._14_2_ = (ushort)bVar54 - sVar67;
    auVar69 = pabsw(auVar71,auVar71);
    auVar149._0_2_ = (auVar148._0_2_ + auVar47._0_2_) - sVar64;
    auVar149._2_2_ = (auVar148._2_2_ + uVar48) - sVar67;
    auVar149._4_2_ = (auVar148._4_2_ + (ushort)bVar49) - sVar64;
    auVar149._6_2_ = (auVar148._6_2_ + (ushort)bVar50) - sVar67;
    auVar149._8_2_ = (auVar148._8_2_ + (ushort)bVar51) - sVar64;
    auVar149._10_2_ = (auVar148._10_2_ + (ushort)bVar52) - sVar67;
    auVar149._12_2_ = (auVar148._12_2_ + (ushort)bVar53) - sVar64;
    auVar149._14_2_ = (auVar148._14_2_ + (ushort)bVar54) - sVar67;
    auVar57 = pabsw(auVar82,auVar149);
    auVar150._0_2_ = -(ushort)(sVar125 < auVar69._0_2_);
    auVar150._2_2_ = -(ushort)(sVar131 < auVar69._2_2_);
    auVar150._4_2_ = -(ushort)(sVar133 < auVar69._4_2_);
    auVar150._6_2_ = -(ushort)(sVar135 < auVar69._6_2_);
    auVar150._8_2_ = -(ushort)(sVar137 < auVar69._8_2_);
    auVar150._10_2_ = -(ushort)(sVar139 < auVar69._10_2_);
    auVar150._12_2_ = -(ushort)(sVar141 < auVar69._12_2_);
    auVar150._14_2_ = -(ushort)(sVar143 < auVar69._14_2_);
    auVar70._0_2_ = -(ushort)(auVar57._0_2_ < auVar69._0_2_);
    auVar70._2_2_ = -(ushort)(auVar57._2_2_ < auVar69._2_2_);
    auVar70._4_2_ = -(ushort)(auVar57._4_2_ < auVar69._4_2_);
    auVar70._6_2_ = -(ushort)(auVar57._6_2_ < auVar69._6_2_);
    auVar70._8_2_ = -(ushort)(auVar57._8_2_ < auVar69._8_2_);
    auVar70._10_2_ = -(ushort)(auVar57._10_2_ < auVar69._10_2_);
    auVar70._12_2_ = -(ushort)(auVar57._12_2_ < auVar69._12_2_);
    auVar70._14_2_ = -(ushort)(auVar57._14_2_ < auVar69._14_2_);
    auVar129._0_2_ = -(ushort)(auVar57._0_2_ < sVar125);
    auVar129._2_2_ = -(ushort)(auVar57._2_2_ < sVar131);
    auVar129._4_2_ = -(ushort)(auVar57._4_2_ < sVar133);
    auVar129._6_2_ = -(ushort)(auVar57._6_2_ < sVar135);
    auVar129._8_2_ = -(ushort)(auVar57._8_2_ < sVar137);
    auVar129._10_2_ = -(ushort)(auVar57._10_2_ < sVar139);
    auVar129._12_2_ = -(ushort)(auVar57._12_2_ < sVar141);
    auVar129._14_2_ = -(ushort)(auVar57._14_2_ < sVar143);
    auVar57 = ~(auVar104 | auVar82) & auVar89 |
              (~auVar93 & auVar55 | auVar66 & auVar93) & (auVar104 | auVar82);
    auVar99 = (~auVar129 & auVar47 | auVar66 & auVar129) & (auVar70 | auVar150);
    auVar69 = ~(auVar70 | auVar150) & auVar89 | auVar99;
    sVar105 = auVar57._0_2_;
    sVar107 = auVar57._2_2_;
    auVar102[1] = (0 < sVar107) * (sVar107 < 0x100) * auVar57[2] - (0xff < sVar107);
    auVar102[0] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[0] - (0xff < sVar105);
    sVar105 = auVar57._4_2_;
    auVar102[2] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[4] - (0xff < sVar105);
    sVar105 = auVar57._6_2_;
    auVar102[3] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[6] - (0xff < sVar105);
    sVar105 = auVar57._8_2_;
    auVar102[4] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[8] - (0xff < sVar105);
    sVar105 = auVar57._10_2_;
    auVar102[5] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[10] - (0xff < sVar105);
    sVar105 = auVar57._12_2_;
    auVar102[6] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[0xc] - (0xff < sVar105);
    sVar105 = auVar57._14_2_;
    auVar102[7] = (0 < sVar105) * (sVar105 < 0x100) * auVar57[0xe] - (0xff < sVar105);
    sVar105 = auVar69._0_2_;
    auVar102[8] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[0] - (0xff < sVar105);
    sVar105 = auVar69._2_2_;
    auVar102[9] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[2] - (0xff < sVar105);
    sVar105 = auVar69._4_2_;
    auVar102[10] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[4] - (0xff < sVar105);
    sVar105 = auVar69._6_2_;
    auVar102[0xb] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[6] - (0xff < sVar105);
    sVar105 = auVar69._8_2_;
    auVar102[0xc] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[8] - (0xff < sVar105);
    sVar105 = auVar69._10_2_;
    auVar102[0xd] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[10] - (0xff < sVar105);
    sVar105 = auVar69._12_2_;
    auVar102[0xe] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[0xc] - (0xff < sVar105);
    sVar105 = auVar69._14_2_;
    auVar102[0xf] = (0 < sVar105) * (sVar105 < 0x100) * auVar69[0xe] - (0xff < sVar105);
    pauVar38[-1][0] = (0 < sVar2) * (sVar2 < 0x100) * auVar97[0] - (0xff < sVar2);
    pauVar38[-1][1] = (0 < sVar3) * (sVar3 < 0x100) * auVar97[2] - (0xff < sVar3);
    pauVar38[-1][2] = (0 < sVar4) * (sVar4 < 0x100) * auVar97[4] - (0xff < sVar4);
    pauVar38[-1][3] = (0 < sVar108) * (sVar108 < 0x100) * auVar97[6] - (0xff < sVar108);
    pauVar38[-1][4] = (0 < sVar5) * (sVar5 < 0x100) * auVar97[8] - (0xff < sVar5);
    pauVar38[-1][5] = (0 < sVar110) * (sVar110 < 0x100) * auVar97[10] - (0xff < sVar110);
    pauVar38[-1][6] = (0 < sVar6) * (sVar6 < 0x100) * auVar97[0xc] - (0xff < sVar6);
    pauVar38[-1][7] = (0 < sVar112) * (sVar112 < 0x100) * auVar97[0xe] - (0xff < sVar112);
    pauVar38[-1][8] = (0 < sVar7) * (sVar7 < 0x100) * auVar65[0] - (0xff < sVar7);
    pauVar38[-1][9] = (0 < sVar114) * (sVar114 < 0x100) * auVar65[2] - (0xff < sVar114);
    pauVar38[-1][10] = (0 < sVar8) * (sVar8 < 0x100) * auVar65[4] - (0xff < sVar8);
    pauVar38[-1][0xb] = (0 < sVar116) * (sVar116 < 0x100) * auVar65[6] - (0xff < sVar116);
    pauVar38[-1][0xc] = (0 < sVar9) * (sVar9 < 0x100) * auVar65[8] - (0xff < sVar9);
    pauVar38[-1][0xd] = (0 < sVar118) * (sVar118 < 0x100) * auVar65[10] - (0xff < sVar118);
    pauVar38[-1][0xe] = (0 < sVar10) * (sVar10 < 0x100) * auVar65[0xc] - (0xff < sVar10);
    pauVar38[-1][0xf] = (0 < sVar124) * (sVar124 < 0x100) * auVar65[0xe] - (0xff < sVar124);
    *pauVar38 = auVar102;
    auVar95._0_2_ = auVar94._0_2_ + 1;
    auVar95._2_2_ = auVar94._2_2_ + 1;
    auVar95._4_2_ = auVar94._4_2_ + 1;
    auVar95._6_2_ = auVar94._6_2_ + 1;
    auVar95._8_2_ = auVar94._8_2_ + 1;
    auVar95._10_2_ = auVar94._10_2_ + 1;
    auVar95._12_2_ = auVar94._12_2_ + 1;
    auVar95._14_2_ = auVar94._14_2_ + 1;
    pauVar38 = (undefined1 (*) [16])(*pauVar38 + stride);
    iVar37 = iVar37 + -1;
    auVar94 = auVar95;
  } while (iVar37 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_32x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i l16;

  int i;
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }

  rep = _mm_set1_epi16((short)0x8000);
  l = _mm_load_si128((const __m128i *)(left + 16));
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r32l = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r32h = paeth_16x1_pred(&l16, &bl, &bh, &tl16);

    _mm_store_si128((__m128i *)dst, r32l);
    _mm_store_si128((__m128i *)(dst + 16), r32h);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}